

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_output_bytes
          (psa_key_derivation_operation_t *operation,uint8_t *output,size_t output_length)

{
  psa_algorithm_t pVar1;
  psa_algorithm_t alg;
  psa_algorithm_t hash_alg;
  psa_algorithm_t kdf_alg;
  psa_status_t status;
  size_t output_length_local;
  uint8_t *output_local;
  psa_key_derivation_operation_t *operation_local;
  
  pVar1 = psa_key_derivation_get_kdf_alg(operation);
  if (operation->alg == 0) {
    operation_local._4_4_ = 0xffffff77;
  }
  else {
    if (operation->capacity < output_length) {
      operation->capacity = 0;
      hash_alg = 0xffffff71;
    }
    else {
      if ((output_length == 0) && (operation->capacity == 0)) {
        return -0x8f;
      }
      operation->capacity = operation->capacity - output_length;
      if ((pVar1 & 0xffffff00) == 0x20000100) {
        hash_alg = psa_key_derivation_hkdf_read
                             (&(operation->ctx).hkdf,pVar1 & 0xff | 0x1000000,output,output_length);
      }
      else {
        if (((pVar1 & 0xffffff00) != 0x20000200) && ((pVar1 & 0xffffff00) != 0x20000300)) {
          return -0x89;
        }
        hash_alg = psa_key_derivation_tls12_prf_read
                             (&(operation->ctx).tls12_prf,pVar1,output,output_length);
      }
    }
    if (hash_alg != 0) {
      pVar1 = operation->alg;
      psa_key_derivation_abort(operation);
      operation->alg = pVar1;
      memset(output,0x21,output_length);
    }
    operation_local._4_4_ = hash_alg;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_key_derivation_output_bytes(
    psa_key_derivation_operation_t *operation,
    uint8_t *output,
    size_t output_length )
{
    psa_status_t status;
    psa_algorithm_t kdf_alg = psa_key_derivation_get_kdf_alg( operation );

    if( operation->alg == 0 )
    {
        /* This is a blank operation. */
        return PSA_ERROR_BAD_STATE;
    }

    if( output_length > operation->capacity )
    {
        operation->capacity = 0;
        /* Go through the error path to wipe all confidential data now
         * that the operation object is useless. */
        status = PSA_ERROR_INSUFFICIENT_DATA;
        goto exit;
    }
    if( output_length == 0 && operation->capacity == 0 )
    {
        /* Edge case: this is a finished operation, and 0 bytes
         * were requested. The right error in this case could
         * be either INSUFFICIENT_CAPACITY or BAD_STATE. Return
         * INSUFFICIENT_CAPACITY, which is right for a finished
         * operation, for consistency with the case when
         * output_length > 0. */
        return( PSA_ERROR_INSUFFICIENT_DATA );
    }
    operation->capacity -= output_length;

#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_HKDF_GET_HASH( kdf_alg );
        status = psa_key_derivation_hkdf_read( &operation->ctx.hkdf, hash_alg,
                                          output, output_length );
    }
    else
    if( PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
             PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        status = psa_key_derivation_tls12_prf_read( &operation->ctx.tls12_prf,
                                               kdf_alg, output,
                                               output_length );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        return( PSA_ERROR_BAD_STATE );
    }

exit:
    if( status != PSA_SUCCESS )
    {
        /* Preserve the algorithm upon errors, but clear all sensitive state.
         * This allows us to differentiate between exhausted operations and
         * blank operations, so we can return PSA_ERROR_BAD_STATE on blank
         * operations. */
        psa_algorithm_t alg = operation->alg;
        psa_key_derivation_abort( operation );
        operation->alg = alg;
        memset( output, '!', output_length );
    }
    return( status );
}